

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertModel
          (FBXConverter *this,Model *model,aiNode *nd,aiMatrix4x4 *node_global_transform)

{
  Geometry *pGVar1;
  pointer __first1;
  pointer __last1;
  MeshGeometry *mesh;
  LineGeometry *line;
  uint *__first2;
  Model *model_00;
  ulong __n;
  aiMatrix4x4 *in_R8;
  pointer ppGVar2;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  Model *local_1e0;
  aiMatrix4x4 *local_1d8;
  pointer local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  uint *local_1a8;
  uint *local_1a0;
  
  local_1f8._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = node_global_transform;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppGVar2 = (model->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (model->geometry).
              super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = model;
  do {
    __last1 = local_1f8._M_impl.super__Vector_impl_data._M_finish;
    __first1 = local_1f8._M_impl.super__Vector_impl_data._M_start;
    if (ppGVar2 == local_1d0) {
      if ((long)local_1f8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1f8._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar3 = (long)local_1f8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1f8._M_impl.super__Vector_impl_data._M_start >> 2;
        __n = -(ulong)(uVar3 >> 0x3e != 0) |
              (long)local_1f8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1f8._M_impl.super__Vector_impl_data._M_start;
        __first2 = (uint *)operator_new__(__n);
        memset(__first2,0,__n);
        nd->mMeshes = __first2;
        nd->mNumMeshes = (uint)uVar3;
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first1,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last1,__first2);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1f8);
      return;
    }
    pGVar1 = *ppGVar2;
    if (pGVar1 == (Geometry *)0x0) {
LAB_0015b3cf:
      std::operator+(&local_1c8,"ignoring unrecognized geometry: ",&(pGVar1->super_Object).name);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                 &local_1c8);
      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    else {
      mesh = (MeshGeometry *)__dynamic_cast(pGVar1,&Geometry::typeinfo,&MeshGeometry::typeinfo);
      model_00 = (Model *)0x0;
      line = (LineGeometry *)__dynamic_cast(pGVar1,&Geometry::typeinfo,&LineGeometry::typeinfo);
      if (mesh == (MeshGeometry *)0x0) {
        if (line == (LineGeometry *)0x0) goto LAB_0015b3cf;
        ConvertLine((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,this,line,
                    model_00,in_R8,nd);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_1a8,local_1a0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8);
      }
      else {
        in_R8 = local_1d8;
        ConvertMesh((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,this,mesh,
                    local_1e0,local_1d8,nd);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_1a8,local_1a0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8);
    }
    ppGVar2 = ppGVar2 + 1;
  } while( true );
}

Assistant:

void FBXConverter::ConvertModel(const Model& model, aiNode& nd, const aiMatrix4x4& node_global_transform)
        {
            const std::vector<const Geometry*>& geos = model.GetGeometry();

            std::vector<unsigned int> meshes;
            meshes.reserve(geos.size());

            for (const Geometry* geo : geos) {

                const MeshGeometry* const mesh = dynamic_cast<const MeshGeometry*>(geo);
                const LineGeometry* const line = dynamic_cast<const LineGeometry*>(geo);
                if (mesh) {
                    const std::vector<unsigned int>& indices = ConvertMesh(*mesh, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else if (line) {
                    const std::vector<unsigned int>& indices = ConvertLine(*line, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else {
                    FBXImporter::LogWarn("ignoring unrecognized geometry: " + geo->Name());
                }
            }

            if (meshes.size()) {
                nd.mMeshes = new unsigned int[meshes.size()]();
                nd.mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), nd.mMeshes);
            }
        }